

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

int * immutable::rrb_nth<int,false,6>(ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t index)

{
  rrb<int,_false,_6> *prVar1;
  internal_node<int,_false> *node;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t local_1c;
  
  local_1c = index;
  prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
  if (index < prVar1->cnt) {
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    uVar4 = prVar1->cnt;
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    uVar2 = uVar4 - prVar1->tail_len;
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    uVar3 = index - uVar2;
    if (index < uVar2) {
      node = (internal_node<int,_false> *)(prVar1->root).ptr;
      prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
      for (uVar4 = prVar1->shift; uVar4 != 0; uVar4 = uVar4 - 6) {
        if ((node->size_table).ptr == (rrb_size_table<false> *)0x0) {
          node = node->child[local_1c >> ((byte)uVar4 & 0x1f) & 0x3f].ptr;
        }
        else {
          node = rrb_details::sized<int,false>(node,&local_1c,uVar4);
        }
      }
      uVar3 = local_1c & 0x3f;
    }
    else {
      node = (internal_node<int,_false> *)
             ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar1->tail);
    }
    return (int *)((long)&((node->size_table).ptr)->size + (ulong)uVar3 * 4);
  }
  __assert_fail("index < rrb->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x7c3,
                "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
               );
}

Assistant:

inline const T& rrb_nth(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t index)
    {
    using namespace rrb_details;
    assert(index < rrb->cnt);
    const uint32_t tail_offset = rrb->cnt - rrb->tail_len;
    if (tail_offset <= index)
      {
      return rrb->tail->child[index - tail_offset];
      }
    else
      {
      const internal_node<T, atomic_ref_counting>* current = (const internal_node<T, atomic_ref_counting>*)rrb->root.ptr;
      for (uint32_t shift = rrb->shift; shift > 0; shift -= bits<N>::rrb_bits)
        {
        if (current->size_table.ptr == nullptr)
          {
          const uint32_t subidx = (index >> shift) & bits<N>::rrb_mask;
          current = current->child[subidx].ptr;
          }
        else
          {
          current = sized(current, &index, shift);
          }
        }
      return ((const leaf_node<T, atomic_ref_counting>*)current)->child[index & bits<N>::rrb_mask];
      }
    }